

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::cmMakefile(cmMakefile *this,cmLocalGenerator *localGenerator)

{
  bool bVar1;
  Internals *pIVar2;
  cmake *pcVar3;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  char *local_448;
  char *dir_1;
  string local_438;
  allocator local_411;
  string local_410;
  char *local_3f0;
  char *dir;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  PolicyMap local_2f8;
  allocator local_2c9;
  value_type local_2c8;
  allocator local_2a1;
  value_type local_2a0;
  allocator local_279;
  value_type local_278;
  allocator local_251;
  value_type local_250;
  allocator local_229;
  value_type local_228;
  allocator local_201;
  value_type local_200;
  allocator local_1d9;
  value_type local_1d8;
  allocator local_1b1;
  value_type local_1b0;
  allocator local_189;
  value_type local_188;
  allocator local_161;
  value_type local_160;
  allocator local_139;
  value_type local_138;
  allocator local_111;
  value_type local_110;
  allocator local_e9;
  value_type local_e8;
  allocator local_c1;
  value_type local_c0;
  allocator local_99;
  value_type local_98;
  allocator local_71;
  value_type local_70;
  allocator local_49;
  value_type local_48;
  cmLocalGenerator *local_18;
  cmLocalGenerator *localGenerator_local;
  cmMakefile *this_local;
  
  local_18 = localGenerator;
  localGenerator_local = (cmLocalGenerator *)this;
  pIVar2 = (Internals *)operator_new(0x20);
  Internals::Internals(pIVar2);
  cmsys::auto_ptr<cmMakefile::Internals>::auto_ptr(&this->Internal,pIVar2);
  std::set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>::set
            (&this->CMP0054ReportedIds);
  std::__cxx11::string::string((string *)&this->ProjectName);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
  ::unordered_map(&this->Targets);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::unordered_map(&this->AliasTargets);
  std::
  map<const_cmTarget_*,_cmGeneratorTarget_*,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::map(&this->GeneratorTargets);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->SourceFiles);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
  ::map(&this->Tests);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LinkDirectories);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ListFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OutputFiles);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
  ::vector(&this->LinkLibraries);
  std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::vector
            (&this->InstallGenerators);
  std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::vector(&this->TestGenerators);
  std::__cxx11::string::string((string *)&this->IncludeFileRegularExpression);
  std::__cxx11::string::string((string *)&this->ComplainFileRegularExpression);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->SourceFileExtensions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->HeaderFileExtensions);
  std::__cxx11::string::string((string *)&this->DefineFlags);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
            (&this->IncludeDirectoriesEntries);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
            (&this->CompileOptionsEntries);
  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::vector
            (&this->CompileDefinitionsEntries);
  std::__cxx11::string::string((string *)&this->DefineFlagsOrig);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&this->SourceGroups);
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::vector(&this->FinalPassCommands);
  this->LocalGenerator = local_18;
  cmLocalGenerator::GetStateSnapshot(&this->StateSnapshot,local_18);
  std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::vector
            (&this->FunctionBlockers);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->FunctionBlockerBarriers)
  ;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->LoopBlockCounter);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->MacrosList);
  cmsys::RegularExpression::RegularExpression(&this->cmDefineRegex);
  cmsys::RegularExpression::RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::RegularExpression(&this->cmNamedCurly);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector(&this->UnConfiguredDirectories);
  cmPropertyMap::cmPropertyMap(&this->Properties);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ListFileStack);
  std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::vector
            (&this->CallStack);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector(&this->ImportedTargetsOwned);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::unordered_map(&this->ImportedTargets);
  std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::vector
            (&this->PolicyStack);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->PolicyBarriers);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  ::unordered_map(&this->OutputToSource);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector(&this->QtUiFilesWithOptions);
  pIVar2 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
  Internals::PushDefinitions(pIVar2);
  pIVar2 = cmsys::auto_ptr<cmMakefile::Internals>::operator->(&this->Internal);
  pIVar2->IsSourceFileTryCompile = false;
  pcVar3 = GetCMakeInstance(this);
  bVar1 = cmake::GetWarnUnused(pcVar3);
  this->WarnUnused = bVar1;
  pcVar3 = GetCMakeInstance(this);
  bVar1 = cmake::GetCheckSystemVars(pcVar3);
  this->CheckSystemVars = bVar1;
  this->Configured = false;
  this->SuppressWatches = false;
  std::__cxx11::string::operator=((string *)&this->IncludeFileRegularExpression,"^.*$");
  std::__cxx11::string::operator=((string *)&this->ComplainFileRegularExpression,"^$");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"c",&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"C",&local_71);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"c++",&local_99);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"cc",&local_c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"cpp",&local_e9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"cxx",&local_111);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"m",&local_139);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"M",&local_161);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"mm",&local_189);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->SourceFileExtensions,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"h",&local_1b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HeaderFileExtensions,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"hh",&local_1d9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HeaderFileExtensions,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"h++",&local_201);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HeaderFileExtensions,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"hm",&local_229);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HeaderFileExtensions,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"hpp",&local_251);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HeaderFileExtensions,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"hxx",&local_279);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HeaderFileExtensions,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"in",&local_2a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HeaderFileExtensions,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"txx",&local_2c9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->HeaderFileExtensions,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::operator=((string *)&this->DefineFlags," ");
  AddDefaultDefinitions(this);
  cmsys::RegularExpression::compile(&this->cmDefineRegex,"#cmakedefine[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmDefine01Regex,"#cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmAtVarRegex,"(@[A-Za-z_0-9/.+-]+@)");
  cmsys::RegularExpression::compile(&this->cmNamedCurly,"^[A-Za-z0-9/_.+-]+{");
  local_2f8.Status.super__Base_bitset<5UL>._M_w[2] = 0;
  local_2f8.Status.super__Base_bitset<5UL>._M_w[3] = 0;
  local_2f8.Status.super__Base_bitset<5UL>._M_w[0] = 0;
  local_2f8.Status.super__Base_bitset<5UL>._M_w[1] = 0;
  local_2f8.Status.super__Base_bitset<5UL>._M_w[4] = 0;
  cmPolicies::PolicyMap::PolicyMap(&local_2f8);
  PushPolicy(this,false,&local_2f8);
  PushPolicyBarrier(this);
  PushLoopBlockBarrier(this);
  this->CheckCMP0000 = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"",&local_319);
  AddSourceGroup(this,&local_318,"^.*$");
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"Source Files",&local_341);
  AddSourceGroup(this,&local_340,
                 "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|f|f90|for|fpp|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$");
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"Header Files",&local_369);
  AddSourceGroup(this,&local_368,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"CMake Rules",&local_391);
  AddSourceGroup(this,&local_390,"\\.rule$");
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b8,"Resources",&local_3b9);
  AddSourceGroup(this,&local_3b8,"\\.plist$");
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e0,"Object Files",(allocator *)((long)&dir + 7));
  AddSourceGroup(this,&local_3e0,"\\.(lo|o|obj)$");
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dir + 7));
  pcVar3 = GetCMakeInstance(this);
  local_3f0 = cmake::GetHomeDirectory(pcVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"CMAKE_SOURCE_DIR",&local_411);
  AddDefinition(this,&local_410,local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_438,"CMAKE_CURRENT_SOURCE_DIR",(allocator *)((long)&dir_1 + 7));
  AddDefinition(this,&local_438,local_3f0);
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)((long)&dir_1 + 7));
  pcVar3 = GetCMakeInstance(this);
  local_448 = cmake::GetHomeOutputDirectory(pcVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"CMAKE_BINARY_DIR",&local_469);
  AddDefinition(this,&local_468,local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,"CMAKE_CURRENT_BINARY_DIR",&local_491);
  AddDefinition(this,&local_490,local_448);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  return;
}

Assistant:

cmMakefile::cmMakefile(cmLocalGenerator* localGenerator)
  : Internal(new Internals),
    LocalGenerator(localGenerator),
    StateSnapshot(localGenerator->GetStateSnapshot())
{
  this->Internal->PushDefinitions();
  this->Internal->IsSourceFileTryCompile = false;

  // Initialize these first since AddDefaultDefinitions calls AddDefinition
  this->WarnUnused = this->GetCMakeInstance()->GetWarnUnused();
  this->CheckSystemVars = this->GetCMakeInstance()->GetCheckSystemVars();

  this->Configured = false;
  this->SuppressWatches = false;

  // Setup the default include file regular expression (match everything).
  this->IncludeFileRegularExpression = "^.*$";
  // Setup the default include complaint regular expression (match nothing).
  this->ComplainFileRegularExpression = "^$";
  // Source and header file extensions that we can handle

  // Set up a list of source and header extensions
  // these are used to find files when the extension
  // is not given
  // The "c" extension MUST precede the "C" extension.
  this->SourceFileExtensions.push_back( "c" );
  this->SourceFileExtensions.push_back( "C" );

  this->SourceFileExtensions.push_back( "c++" );
  this->SourceFileExtensions.push_back( "cc" );
  this->SourceFileExtensions.push_back( "cpp" );
  this->SourceFileExtensions.push_back( "cxx" );
  this->SourceFileExtensions.push_back( "m" );
  this->SourceFileExtensions.push_back( "M" );
  this->SourceFileExtensions.push_back( "mm" );

  this->HeaderFileExtensions.push_back( "h" );
  this->HeaderFileExtensions.push_back( "hh" );
  this->HeaderFileExtensions.push_back( "h++" );
  this->HeaderFileExtensions.push_back( "hm" );
  this->HeaderFileExtensions.push_back( "hpp" );
  this->HeaderFileExtensions.push_back( "hxx" );
  this->HeaderFileExtensions.push_back( "in" );
  this->HeaderFileExtensions.push_back( "txx" );

  this->DefineFlags = " ";

  this->AddDefaultDefinitions();

  this->cmDefineRegex.compile("#cmakedefine[ \t]+([A-Za-z_0-9]*)");
  this->cmDefine01Regex.compile("#cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  this->cmAtVarRegex.compile("(@[A-Za-z_0-9/.+-]+@)");
  this->cmNamedCurly.compile("^[A-Za-z0-9/_.+-]+{");

  // Enter a policy level for this directory.
  this->PushPolicy();

  // Protect the directory-level policies.
  this->PushPolicyBarrier();

  // push empty loop block
  this->PushLoopBlockBarrier();

  // By default the check is not done.  It is enabled by
  // cmListFileCache in the top level if necessary.
  this->CheckCMP0000 = false;

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->AddSourceGroup("", "^.*$");
  this->AddSourceGroup
    ("Source Files",
     "\\.(C|M|c|c\\+\\+|cc|cpp|cxx|f|f90|for|fpp"
     "|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$");
  this->AddSourceGroup("Header Files", CM_HEADER_REGEX);
  this->AddSourceGroup("CMake Rules", "\\.rule$");
  this->AddSourceGroup("Resources", "\\.plist$");
  this->AddSourceGroup("Object Files", "\\.(lo|o|obj)$");
#endif

  {
  const char* dir = this->GetCMakeInstance()->GetHomeDirectory();
  this->AddDefinition("CMAKE_SOURCE_DIR", dir);
  this->AddDefinition("CMAKE_CURRENT_SOURCE_DIR", dir);
  }
  {
  const char* dir = this->GetCMakeInstance()->GetHomeOutputDirectory();
  this->AddDefinition("CMAKE_BINARY_DIR", dir);
  this->AddDefinition("CMAKE_CURRENT_BINARY_DIR", dir);
  }
}